

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

_Bool directory_create(char *path)

{
  _Bool _Var1;
  __mode_t __mask;
  mode_t saved;
  char *path_local;
  
  __mask = umask(0);
  mkdir(path,0x1fd);
  umask(__mask);
  _Var1 = file_exists(path);
  return _Var1;
}

Assistant:

bool directory_create (const char *path) {
    #ifdef WIN32
    CreateDirectoryA(path, NULL);
    #else
    mode_t saved = umask(0);
    mkdir(path, 0775);
    umask(saved);
    #endif
    
    return file_exists(path);
}